

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)

{
  SQArray *this;
  bool bVar1;
  SQObjectPtr *in_RAX;
  SQObject *o;
  SQObjectPtr *arr;
  
  if (v->_top - v->_stackbase < 2) {
    SQVM::Raise_Error(v,"not enough params in the stack");
  }
  else {
    arr = in_RAX;
    bVar1 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&arr);
    if (bVar1) {
      this = (arr->super_SQObject)._unVal.pArray;
      o = &SQVM::GetUp(v,-1)->super_SQObject;
      SQArray::Append(this,o);
      SQVM::Pop(v);
      return 0;
    }
  }
  return -1;
}

Assistant:

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v,2);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    _array(*arr)->Append(v->GetUp(-1));
    v->Pop();
    return SQ_OK;
}